

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve.cpp
# Opt level: O2

ExprPtr __thiscall mathiu::impl::solve(impl *this,ExprPtr *ex,ExprPtr *var,ExprPtr *domain)

{
  InternalPatternT<matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  *pIVar1;
  InternalPatternT<matchit::impl::Id<mathiu::impl::Product>_> *pIVar2;
  InternalPatternT<matchit::impl::Id<mathiu::impl::PieceWise>_> *pIVar3;
  element_type *peVar4;
  pointer ppVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  ExprPtr *pEVar7;
  ExprPtr *pEVar8;
  bool bVar9;
  enable_if_t<isTupleLikeV<const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_&>,_bool>
  eVar10;
  ostream *poVar11;
  string *psVar12;
  variant_alternative_t<1UL,_variant<monostate,_const_tuple<RelationalKind,_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_*,_const_int_*,_const_Product_*,_const_PieceWise_*,_bool>_>
  *value;
  shared_ptr<const_mathiu::impl::Expr> *lhs;
  shared_ptr<const_mathiu::impl::Expr> *rhs;
  variant_alternative_t<2UL,_variant<monostate,_const_tuple<RelationalKind,_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_*,_const_int_*,_const_Product_*,_const_PieceWise_*,_bool>_>
  *value_00;
  variant_alternative_t<3UL,_variant<monostate,_const_tuple<RelationalKind,_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_*,_const_int_*,_const_Product_*,_const_PieceWise_*,_bool>_>
  *value_01;
  Product *pPVar13;
  _Compatible_tree<mathiu::impl::ExprPtrLess> *__src;
  _Base_ptr p_Var14;
  variant_alternative_t<4UL,_variant<monostate,_const_tuple<RelationalKind,_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_*,_const_int_*,_const_Product_*,_const_PieceWise_*,_bool>_>
  *value_02;
  PieceWise *pPVar15;
  ExprPtr *ex_00;
  ExprPtr *ex_01;
  ExprPtr *ex_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  IdProcess IVar16;
  __shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *p_Var17;
  _Rb_tree_header *this_00;
  pointer ex_03;
  ExprPtr EVar18;
  __shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> local_9e8;
  undefined1 local_9d8 [8];
  _Rb_tree_header _Stack_9d0;
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_9a0;
  __shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> local_970;
  variant<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
  *local_960;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_958;
  __shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> local_950;
  undefined1 *local_940;
  undefined1 *local_938;
  undefined1 *local_930;
  int local_928;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_920;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_910;
  __shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *local_900;
  undefined1 local_8f8 [8];
  _Rb_tree_header _Stack_8f0;
  Set solutionSet;
  ContextT context;
  And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>_>
  local_7d0;
  Id<mathiu::impl::Product> *local_750;
  ExprPtr *local_748;
  ExprPtr *local_740;
  And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>_>
  local_738;
  Id<mathiu::impl::PieceWise> *local_6d0;
  ExprPtr *local_6c8;
  ExprPtr *local_6c0;
  And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>_>
  local_6b8;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> *local_628;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> *local_620;
  ExprPtr *local_618;
  ExprPtr *local_610;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> iE2;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> iE1;
  Symbol var_;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  local_598;
  Id<mathiu::impl::PieceWise> iPieceWise;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  local_538;
  Id<mathiu::impl::Product> iP;
  App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>
  local_4a8;
  Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_458;
  And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>_>
  local_400;
  And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>_>
  local_398;
  App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>
  local_330;
  App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>
  local_2c8;
  And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>_>
  local_250;
  And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>_>
  local_1d0;
  And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>_>
  local_150;
  And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>_>
  local_c0;
  
  poVar11 = std::operator<<((ostream *)&std::cout,"solve: ");
  toString_abi_cxx11_((string *)&context,(impl *)ex,ex_00);
  poVar11 = std::operator<<(poVar11,(string *)&context);
  poVar11 = std::operator<<(poVar11,",\t");
  toString_abi_cxx11_((string *)&local_6b8,(impl *)var,ex_01);
  poVar11 = std::operator<<(poVar11,(string *)&local_6b8);
  poVar11 = std::operator<<(poVar11,",\t");
  toString_abi_cxx11_((string *)&local_7d0,(impl *)domain,ex_02);
  poVar11 = std::operator<<(poVar11,(string *)&local_7d0);
  std::endl<char,std::char_traits<char>>(poVar11);
  std::__cxx11::string::~string((string *)&local_7d0);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::~string((string *)&context);
  psVar12 = (string *)
            std::
            get<2ul,int,mathiu::impl::Fraction,mathiu::impl::Symbol,mathiu::impl::Pi,mathiu::impl::E,mathiu::impl::I,mathiu::impl::Infinity,mathiu::impl::Sum,mathiu::impl::Product,mathiu::impl::Power,mathiu::impl::Log,mathiu::impl::Sin,mathiu::impl::Arctan,mathiu::impl::Set,mathiu::impl::List,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,mathiu::impl::PieceWise,mathiu::impl::Pair,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>,mathiu::impl::True,mathiu::impl::False,mathiu::impl::Logical,mathiu::impl::SetOp>
                      (&((var->
                         super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->super_ExprVariant);
  std::__cxx11::string::string((string *)&var_,psVar12);
  matchit::impl::Id<mathiu::impl::Product>::Id(&iP);
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id(&iE1);
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id(&iE2);
  matchit::impl::Id<mathiu::impl::PieceWise>::Id(&iPieceWise);
  std::
  _Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::_Tuple_impl((_Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                 *)&local_458,&iE1,&iE2);
  local_458.mPatterns.
  super__Tuple_impl<0UL,_mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .super__Head_base<0UL,_mathiu::impl::RelationalKind,_false>._M_head_impl = kEQUAL;
  matchit::impl::
  as<std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>
  ::{lambda(auto:1)#1}::operator()
            (&local_2c8,
             (_lambda_auto_1__1_ *)
             &matchit::impl::
              as<std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>
             ,&local_458);
  context.mMemHolder._M_elems[0].
  super__Variant_base<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  .
  super__Move_assign_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  ._M_u = (_Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
           )&matchit::impl::deref;
  matchit::impl::
  App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>
  ::App((App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>
         *)((long)&context.mMemHolder._M_elems[0].
                   super__Variant_base<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
                   .
                   super__Move_assign_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
                   .
                   super__Copy_assign_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
                   .
                   super__Move_ctor_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
           + 8),&local_2c8);
  matchit::impl::
  App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>
  ::App((App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>
         *)&local_150,
        (App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>
         *)&context);
  local_150.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  local_150.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mPattern = true;
  std::
  _Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::~_Tuple_impl((_Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                  *)((long)&context.mMemHolder._M_elems[1].
                            super__Variant_base<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
                            .
                            super__Move_assign_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
                            .
                            super__Copy_assign_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
                            .
                            super__Move_ctor_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
                    + 8));
  matchit::impl::
  And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>_>
  ::And(&local_c0,&local_150);
  matchit::impl::
  And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>_>
  ::And(&local_6b8,&local_c0);
  local_628 = &iE1;
  local_620 = &iE2;
  local_618 = var;
  local_610 = domain;
  set<std::shared_ptr<mathiu::impl::Expr_const>const&>((impl *)&local_950,var);
  local_940 = &matchit::impl::deref;
  local_938 = &matchit::impl::asPointer<int>;
  local_930 = &matchit::impl::deref;
  local_928 = 0;
  local_920.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  local_920.mPattern = true;
  local_910.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  local_910.mPattern = true;
  local_900 = &local_950;
  set<>();
  matchit::impl::Id<mathiu::impl::Product>::Id((Id<mathiu::impl::Product> *)&local_538,&iP);
  matchit::impl::as<mathiu::impl::Product>::{lambda(auto:1)#1}::operator()
            (&local_330,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Product>,
             (Id<mathiu::impl::Product> *)&local_538);
  context.mMemHolder._M_elems[0].
  super__Variant_base<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  .
  super__Move_assign_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  ._M_u = (_Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
           )&matchit::impl::deref;
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>
  ::App((App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>
         *)((long)&context.mMemHolder._M_elems[0].
                   super__Variant_base<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
                   .
                   super__Move_assign_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
                   .
                   super__Copy_assign_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
                   .
                   super__Move_ctor_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
           + 8),&local_330);
  matchit::impl::
  App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>
  ::App((App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>
         *)&local_250,
        (App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>
         *)&context);
  local_250.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  local_250.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mPattern = true;
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                       *)((long)&context.mMemHolder._M_elems[1].
                                 super__Variant_base<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
                                 .
                                 super__Move_assign_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
                                 .
                                 super__Copy_assign_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
                                 .
                                 super__Move_ctor_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
                         + 8));
  matchit::impl::
  And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>_>
  ::And(&local_1d0,&local_250);
  matchit::impl::
  And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>_>
  ::And(&local_7d0,&local_1d0);
  local_750 = &iP;
  local_748 = var;
  local_740 = domain;
  matchit::impl::Id<mathiu::impl::PieceWise>::Id
            ((Id<mathiu::impl::PieceWise> *)&local_598,&iPieceWise);
  matchit::impl::as<mathiu::impl::PieceWise>::{lambda(auto:1)#1}::operator()
            (&local_4a8,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::PieceWise>,
             (Id<mathiu::impl::PieceWise> *)&local_598);
  context.mMemHolder._M_elems[0].
  super__Variant_base<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  .
  super__Move_assign_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  ._M_u = (_Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
           )&matchit::impl::deref;
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>
  ::App((App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>
         *)((long)&context.mMemHolder._M_elems[0].
                   super__Variant_base<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
                   .
                   super__Move_assign_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
                   .
                   super__Copy_assign_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
                   .
                   super__Move_ctor_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
           + 8),&local_4a8);
  matchit::impl::
  App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>
  ::App((App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>
         *)&local_400,
        (App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>
         *)&context);
  local_400.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  local_400.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mPattern = true;
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                       *)((long)&context.mMemHolder._M_elems[1].
                                 super__Variant_base<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
                                 .
                                 super__Move_assign_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
                                 .
                                 super__Copy_assign_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
                                 .
                                 super__Move_ctor_alias<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
                         + 8));
  matchit::impl::
  And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>_>
  ::And(&local_398,&local_400);
  matchit::impl::
  And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>_>
  ::And(&local_738,&local_398);
  local_9e8._M_ptr = (element_type *)0x0;
  local_9e8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_6d0 = &iPieceWise;
  local_6c8 = var;
  local_6c0 = domain;
  memset(&context,0,200);
  matchit::impl::
  Context<bool,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_bool,_bool,_const_int_*,_bool,_bool,_const_mathiu::impl::Product_*,_bool,_bool,_const_mathiu::impl::PieceWise_*,_bool>
  ::Context(&context);
  bVar9 = matchit::impl::
          PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
          ::
          matchPatternImpl<std::shared_ptr<mathiu::impl::Expr_const>const&,matchit::impl::Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
                    (ex,&local_6b8.mPatterns.
                         super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>_>
                         .
                         super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
                         ._M_head_impl,1,&context);
  if (bVar9) {
    peVar4 = (ex->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_9d8 = (undefined1  [8])(element_type *)0x0;
    if (*(__index_type *)
         ((long)&(peVar4->super_ExprVariant).
                 super__Variant_base<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                 .
                 super__Move_assign_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                 .
                 super__Copy_assign_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                 .
                 super__Move_ctor_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                 .
                 super__Copy_ctor_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                 .
                 super__Variant_storage_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
         + 0x38) == '\x0f') {
      local_9d8 = (undefined1  [8])peVar4;
    }
    matchit::impl::
    Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>
    ::
    emplace_back<std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*>
              ((Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>
                *)&context,
               (tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                **)local_9d8);
    value = std::
            get<1ul,std::monostate,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,int_const*,mathiu::impl::Product_const*,mathiu::impl::PieceWise_const*,bool>
                      (context.mMemHolder._M_elems + (context.mSize - 1));
    bVar9 = matchit::impl::
            PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
            ::
            matchPatternImpl<std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*&,matchit::impl::Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
                      (value,(App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
                              *)((long)&local_6b8.mPatterns.
                                        super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>_>
                                        .
                                        super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>_>
                                        .
                                        super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>,_false>
                                        ._M_head_impl + 0x70),4,&context);
    if (bVar9) {
      pIVar1 = (InternalPatternT<matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                *)((long)&local_6b8.mPatterns.
                          super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>_>
                          .
                          super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>_>
                          .
                          super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>,_false>
                          ._M_head_impl + 0x18);
      eVar10 = matchit::impl::
               matchPattern<std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const&,matchit::impl::Ds<mathiu::impl::RelationalKind,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>,matchit::impl::Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
                         (*value,pIVar1,5,&context);
      matchit::impl::
      PatternTraits<matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
      ::processIdImpl(pIVar1,4,(uint)eVar10);
    }
    else {
      eVar10 = false;
    }
    IVar16 = (IdProcess)eVar10;
    pIVar1 = (InternalPatternT<matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
              *)((long)&local_6b8.mPatterns.
                        super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>_>
                        .
                        super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>_>
                        .
                        super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>,_false>
                        ._M_head_impl + 0x18);
    matchit::impl::
    PatternTraits<matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
    ::processIdImpl(pIVar1,3,IVar16);
    matchit::impl::
    PatternTraits<matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
    ::processIdImpl(pIVar1,2,IVar16);
    matchit::impl::
    PatternTraits<matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
    ::processIdImpl(pIVar1,1,IVar16);
  }
  else {
    eVar10 = false;
  }
  matchit::impl::
  PatternTraits<matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  ::processIdImpl((InternalPatternT<matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                   *)((long)&local_6b8.mPatterns.
                             super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>_>
                             .
                             super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>_>
                             .
                             super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>,_false>
                             ._M_head_impl + 0x18),0,(uint)eVar10);
  if (eVar10 != false) {
    lhs = matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::get(local_628);
    rhs = matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::get(local_620);
    operator-((impl *)&local_9a0,lhs,rhs);
    expand((impl *)local_9d8,(ExprPtr *)&local_9a0);
    solve((impl *)&solutionSet,(ExprPtr *)local_9d8,local_618,local_610);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_9d0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_9a0._M_impl.super__Rb_tree_header);
    std::__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_9e8,
               (__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *)&solutionSet);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &solutionSet.super_ExprPtrSet._M_t._M_impl.super__Rb_tree_header);
    goto LAB_0019bf7d;
  }
  memset(&context,0,200);
  matchit::impl::
  Context<bool,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_bool,_bool,_const_int_*,_bool,_bool,_const_mathiu::impl::Product_*,_bool,_bool,_const_mathiu::impl::PieceWise_*,_bool>
  ::Context(&context);
  bVar9 = matchit::impl::
          PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
          ::
          matchPatternImpl<std::shared_ptr<mathiu::impl::Expr_const>const&,matchit::impl::Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
                    (ex,&local_910,1,&context);
  if (bVar9) {
    peVar4 = (ex->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_9d8 = (undefined1  [8])(element_type *)0x0;
    if (*(__index_type *)
         ((long)&(peVar4->super_ExprVariant).
                 super__Variant_base<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                 .
                 super__Move_assign_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                 .
                 super__Copy_assign_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                 .
                 super__Move_ctor_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                 .
                 super__Copy_ctor_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                 .
                 super__Variant_storage_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
         + 0x38) == '\0') {
      local_9d8 = (undefined1  [8])peVar4;
    }
    matchit::impl::
    Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>
    ::emplace_back<int_const*>
              ((Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>
                *)&context,(int **)local_9d8);
    value_00 = std::
               get<2ul,std::monostate,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,int_const*,mathiu::impl::Product_const*,mathiu::impl::PieceWise_const*,bool>
                         (context.mMemHolder._M_elems + (context.mSize - 1));
    bVar9 = matchit::impl::
            PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
            ::
            matchPatternImpl<int_const*&,matchit::impl::Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
                      (value_00,&local_920,4,&context);
    if ((!bVar9) || (p_Var17 = local_900, local_928 != **value_00)) goto LAB_0019bbf0;
LAB_0019bc2d:
    std::__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *)local_9d8,
               p_Var17);
LAB_0019bf69:
    std::__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_9e8,
               (__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *)local_9d8);
    this_00 = &_Stack_9d0;
  }
  else {
LAB_0019bbf0:
    memset(&context,0,200);
    matchit::impl::
    Context<bool,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_bool,_bool,_const_int_*,_bool,_bool,_const_mathiu::impl::Product_*,_bool,_bool,_const_mathiu::impl::PieceWise_*,_bool>
    ::Context(&context);
    bVar9 = freeOf(ex,var);
    if (bVar9) {
      p_Var17 = &local_970;
      goto LAB_0019bc2d;
    }
    memset(&context,0,200);
    matchit::impl::
    Context<bool,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_bool,_bool,_const_int_*,_bool,_bool,_const_mathiu::impl::Product_*,_bool,_bool,_const_mathiu::impl::PieceWise_*,_bool>
    ::Context(&context);
    bVar9 = matchit::impl::
            PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
            ::
            matchPatternImpl<std::shared_ptr<mathiu::impl::Expr_const>const&,matchit::impl::Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
                      (ex,&local_7d0.mPatterns.
                           super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>_>
                           .
                           super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
                           ._M_head_impl,1,&context);
    if (bVar9) {
      peVar4 = (ex->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      local_9d8 = (undefined1  [8])(element_type *)0x0;
      if (*(__index_type *)
           ((long)&(peVar4->super_ExprVariant).
                   super__Variant_base<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                   .
                   super__Move_assign_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                   .
                   super__Copy_assign_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                   .
                   super__Move_ctor_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                   .
                   super__Copy_ctor_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                   .
                   super__Variant_storage_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
           + 0x38) == '\b') {
        local_9d8 = (undefined1  [8])peVar4;
      }
      matchit::impl::
      Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>
      ::emplace_back<mathiu::impl::Product_const*>
                ((Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>
                  *)&context,(Product **)local_9d8);
      value_01 = std::
                 get<3ul,std::monostate,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,int_const*,mathiu::impl::Product_const*,mathiu::impl::PieceWise_const*,bool>
                           (context.mMemHolder._M_elems + (context.mSize - 1));
      bVar9 = matchit::impl::
              PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
              ::
              matchPatternImpl<mathiu::impl::Product_const*&,matchit::impl::Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
                        (value_01,(App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
                                   *)((long)&local_7d0.mPatterns.
                                             super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>_>
                                             .
                                             super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>_>
                                             .
                                             super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>,_false>
                                             ._M_head_impl + 0x60),4,&context);
      if (bVar9) {
        pIVar2 = (InternalPatternT<matchit::impl::Id<mathiu::impl::Product>_> *)
                 ((long)&local_7d0.mPatterns.
                         super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>_>
                         .
                         super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>_>
                         .
                         super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>,_false>
                         ._M_head_impl + 0x18);
        bVar9 = matchit::impl::
                matchPattern<mathiu::impl::Product_const&,matchit::impl::Id<mathiu::impl::Product>,matchit::impl::Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
                          (*value_01,pIVar2,5,&context);
        matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
                  (pIVar2,4,(uint)bVar9);
      }
      else {
        bVar9 = false;
      }
      IVar16 = (IdProcess)bVar9;
      pIVar2 = (InternalPatternT<matchit::impl::Id<mathiu::impl::Product>_> *)
               ((long)&local_7d0.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>_>
                       .
                       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>_>
                       .
                       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>,_false>
                       ._M_head_impl + 0x18);
      matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
                (pIVar2,3,IVar16);
      matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
                (pIVar2,2,IVar16);
      matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
                (pIVar2,1,IVar16);
    }
    else {
      bVar9 = false;
    }
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
              ((InternalPatternT<matchit::impl::Id<mathiu::impl::Product>_> *)
               ((long)&local_7d0.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>_>
                       .
                       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>_>
                       .
                       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>,_false>
                       ._M_head_impl + 0x18),0,(uint)bVar9);
    if (bVar9 != false) {
      pPVar13 = matchit::impl::Id<mathiu::impl::Product>::get(local_750);
      p_Var14 = (pPVar13->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pPVar13 = matchit::impl::Id<mathiu::impl::Product>::get(local_750);
      pEVar8 = local_740;
      pEVar7 = local_748;
      _Stack_8f0._M_header._M_left = &_Stack_8f0._M_header;
      _Stack_8f0._M_header._M_parent = (_Base_ptr)0x0;
      local_8f8 = (undefined1  [8])0x0;
      _Stack_8f0._M_header._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      _Stack_8f0._M_node_count = 0;
      _Stack_8f0._M_header._M_right = _Stack_8f0._M_header._M_left;
      for (; (_Rb_tree_header *)p_Var14 !=
             &(pPVar13->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header;
          p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
        std::
        _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
        ::_Rb_tree(&local_9a0,
                   (_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                    *)local_8f8);
        solve((impl *)&local_960,(ExprPtr *)&p_Var14[1]._M_left,pEVar7,pEVar8);
        __src = (_Compatible_tree<mathiu::impl::ExprPtrLess> *)
                std::
                get<13ul,int,mathiu::impl::Fraction,mathiu::impl::Symbol,mathiu::impl::Pi,mathiu::impl::E,mathiu::impl::I,mathiu::impl::Infinity,mathiu::impl::Sum,mathiu::impl::Product,mathiu::impl::Power,mathiu::impl::Log,mathiu::impl::Sin,mathiu::impl::Arctan,mathiu::impl::Set,mathiu::impl::List,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,mathiu::impl::PieceWise,mathiu::impl::Pair,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>,mathiu::impl::True,mathiu::impl::False,mathiu::impl::Logical,mathiu::impl::SetOp>
                          (local_960);
        std::
        _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
        ::_M_merge_unique<mathiu::impl::ExprPtrLess>(&local_9a0,__src);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_958);
        std::_Rb_tree_header::_Rb_tree_header(&_Stack_9d0,&local_9a0._M_impl.super__Rb_tree_header);
        std::
        _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
        ::operator=((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                     *)local_8f8,
                    (_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                     *)local_9d8);
        std::
        _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
        ::~_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                     *)local_9d8);
        std::
        _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
        ::~_Rb_tree(&local_9a0);
      }
      std::_Rb_tree_header::_Rb_tree_header
                (&solutionSet.super_ExprPtrSet._M_t._M_impl.super__Rb_tree_header,&_Stack_8f0);
      std::
      _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                   *)local_8f8);
      std::make_shared<mathiu::impl::Expr_const,mathiu::impl::Set>((Set *)local_9d8);
      std::
      _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                   *)&solutionSet);
      goto LAB_0019bf69;
    }
    memset(&context,0,200);
    matchit::impl::
    Context<bool,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_bool,_bool,_const_int_*,_bool,_bool,_const_mathiu::impl::Product_*,_bool,_bool,_const_mathiu::impl::PieceWise_*,_bool>
    ::Context(&context);
    bVar9 = matchit::impl::
            PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
            ::
            matchPatternImpl<std::shared_ptr<mathiu::impl::Expr_const>const&,matchit::impl::Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
                      (ex,&local_738.mPatterns.
                           super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>_>
                           .
                           super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
                           ._M_head_impl,1,&context);
    if (bVar9) {
      peVar4 = (ex->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      local_9d8 = (undefined1  [8])(element_type *)0x0;
      if (*(__index_type *)
           ((long)&(peVar4->super_ExprVariant).
                   super__Variant_base<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                   .
                   super__Move_assign_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                   .
                   super__Copy_assign_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                   .
                   super__Move_ctor_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                   .
                   super__Copy_ctor_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                   .
                   super__Variant_storage_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
           + 0x38) == '\x10') {
        local_9d8 = (undefined1  [8])peVar4;
      }
      matchit::impl::
      Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>
      ::emplace_back<mathiu::impl::PieceWise_const*>
                ((Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>
                  *)&context,(PieceWise **)local_9d8);
      value_02 = std::
                 get<4ul,std::monostate,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,int_const*,mathiu::impl::Product_const*,mathiu::impl::PieceWise_const*,bool>
                           (context.mMemHolder._M_elems + (context.mSize - 1));
      bVar9 = matchit::impl::
              PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
              ::
              matchPatternImpl<mathiu::impl::PieceWise_const*&,matchit::impl::Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
                        (value_02,(App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
                                   *)((long)&local_738.mPatterns.
                                             super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>_>
                                             .
                                             super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>_>
                                             .
                                             super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>,_false>
                                             ._M_head_impl + 0x48),4,&context);
      if (bVar9) {
        pIVar3 = (InternalPatternT<matchit::impl::Id<mathiu::impl::PieceWise>_> *)
                 ((long)&local_738.mPatterns.
                         super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>_>
                         .
                         super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>_>
                         .
                         super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>,_false>
                         ._M_head_impl + 0x18);
        bVar9 = matchit::impl::
                matchPattern<mathiu::impl::PieceWise_const&,matchit::impl::Id<mathiu::impl::PieceWise>,matchit::impl::Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
                          (*value_02,pIVar3,5,&context);
        matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::PieceWise>_>::processIdImpl
                  (pIVar3,4,(uint)bVar9);
      }
      else {
        bVar9 = false;
      }
      IVar16 = (IdProcess)bVar9;
      pIVar3 = (InternalPatternT<matchit::impl::Id<mathiu::impl::PieceWise>_> *)
               ((long)&local_738.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>_>
                       .
                       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>_>
                       .
                       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>,_false>
                       ._M_head_impl + 0x18);
      matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::PieceWise>_>::processIdImpl
                (pIVar3,3,IVar16);
      matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::PieceWise>_>::processIdImpl
                (pIVar3,2,IVar16);
      matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::PieceWise>_>::processIdImpl
                (pIVar3,1,IVar16);
    }
    else {
      bVar9 = false;
    }
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::PieceWise>_>::processIdImpl
              ((InternalPatternT<matchit::impl::Id<mathiu::impl::PieceWise>_> *)
               ((long)&local_738.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>_>
                       .
                       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>_>
                       .
                       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>,_false>
                       ._M_head_impl + 0x18),0,(uint)bVar9);
    if (bVar9 == false) {
      memset(&context,0,200);
      matchit::impl::
      Context<bool,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_bool,_bool,_const_int_*,_bool,_bool,_const_mathiu::impl::Product_*,_bool,_bool,_const_mathiu::impl::PieceWise_*,_bool>
      ::Context(&context);
      solvePoly((ExprPtr *)local_9d8,ex);
      intersect((impl *)&local_9a0,(ExprPtr *)local_9d8,domain);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_9d0);
      std::__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_9e8,
                 (__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *)&local_9a0);
      this_00 = &local_9a0._M_impl.super__Rb_tree_header;
    }
    else {
      pPVar15 = matchit::impl::Id<mathiu::impl::PieceWise>::get(local_6d0);
      ex_03 = (pPVar15->
              super_vector<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::allocator<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
              ).
              super__Vector_base<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::allocator<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      pPVar15 = matchit::impl::Id<mathiu::impl::PieceWise>::get(local_6d0);
      ppVar5 = (pPVar15->
               super_vector<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::allocator<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
               ).
               super__Vector_base<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::allocator<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      std::__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *)local_8f8,
                 (__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *)false_);
      pEVar8 = local_6c0;
      pEVar7 = local_6c8;
      for (; ex_03 != ppVar5; ex_03 = ex_03 + 1) {
        solveInequation((impl *)&local_9a0,&ex_03->second,pEVar7,pEVar8);
        solve((impl *)local_9d8,&ex_03->first,pEVar7,(ExprPtr *)&local_9a0);
        union_((impl *)&solutionSet,(ExprPtr *)local_8f8,(ExprPtr *)local_9d8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_9d0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_9a0._M_impl.super__Rb_tree_header);
        std::__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *)local_8f8,
                   (__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *)
                   &solutionSet);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &solutionSet.super_ExprPtrSet._M_t._M_impl.super__Rb_tree_header);
      }
      this_00 = &_Stack_9d0;
      local_9d8 = local_8f8;
      _Stack_9d0._M_header._M_color = _Stack_8f0._M_header._M_color;
      _Stack_9d0._M_header._4_4_ = _Stack_8f0._M_header._4_4_;
      local_8f8 = (undefined1  [8])0x0;
      _Stack_8f0._M_header._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_8f0);
      std::__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_9e8,
                 (__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *)local_9d8);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
LAB_0019bf7d:
  _Var6._M_pi = local_9e8._M_refcount._M_pi;
  local_9e8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(element_type **)this = local_9e8._M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var6._M_pi;
  local_9e8._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_9e8._M_refcount);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                       *)((long)&local_738.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>,_false>
                                 ._M_head_impl + 0x18));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                       *)((long)&local_398.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>,_false>
                                 ._M_head_impl + 0x18));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                       *)((long)&local_400.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>,_false>
                                 ._M_head_impl + 0x18));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                       *)((long)&local_4a8.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage(&local_598);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                       *)((long)&local_7d0.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>,_false>
                                 ._M_head_impl + 0x18));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                       *)((long)&local_1d0.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>,_false>
                                 ._M_head_impl + 0x18));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                       *)((long)&local_250.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>,_false>
                                 ._M_head_impl + 0x18));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                       *)((long)&local_330.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage(&local_538);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_970._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_950._M_refcount);
  std::
  _Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::~_Tuple_impl((_Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                  *)((long)&local_6b8.mPatterns.
                            super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>_>
                            .
                            super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>_>
                            .
                            super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>,_false>
                            ._M_head_impl + 0x18));
  std::
  _Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::~_Tuple_impl((_Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                  *)((long)&local_c0.mPatterns.
                            super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>_>
                            .
                            super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>_>
                            .
                            super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>,_false>
                            ._M_head_impl + 0x18));
  std::
  _Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::~_Tuple_impl((_Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                  *)((long)&local_150.mPatterns.
                            super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>_>
                            .
                            super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>_>
                            .
                            super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>,_false>
                            ._M_head_impl + 0x18));
  std::
  _Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::~_Tuple_impl((_Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                  *)((long)&local_2c8.mPattern.mPatterns.
                            super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
                            .
                            super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
                            .
                            super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_false>
                    + 8));
  std::
  _Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::~_Tuple_impl((_Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                  *)&local_458);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                       *)&iPieceWise);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&iE2);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&iE1);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                       *)&iP);
  std::__cxx11::string::~string((string *)&var_);
  EVar18.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  EVar18.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ExprPtr)EVar18.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr solve(ExprPtr const &ex, ExprPtr const &var, ExprPtr const &domain)
    {
#if DEBUG
        std::cout << "solve: " << toString(ex) << ",\t" << toString(var) << ",\t" << toString(domain) << std::endl;
#endif // DEBUG

        auto const var_ = std::get<Symbol>(*var);
        using namespace matchit;
        const auto freeOfVar = meet([&](auto &&e)
                                    { return freeOf(e, var); });
        Id<Product> iP;
        Id<ExprPtr> iE1, iE2;
        Id<PieceWise> iPieceWise;
        return match(ex)(
            pattern | some(as<Relational>(ds(RelationalKind::kEQUAL, iE1, iE2))) = [&]
            { return solve(expand(*iE1 - *iE2), var, domain); },
            pattern | some(as<Integer>(0)) = expr(set(var)),
            pattern | freeOfVar = expr(set()),
            pattern | some(as<Product>(iP)) = [&]
            {
                auto solutionSet = std::accumulate((*iP).begin(), (*iP).end(), Set{}, [&](Set solutions, auto &&e)
                                                   {
                                                       solutions.merge(const_cast<Set &>(std::get<Set>(*solve(e.second, var, domain)))); // it is safe to const_cast a temp.
                                                       return solutions;
                                                   });
                return makeSharedExprPtr(std::move(solutionSet));
            },
            pattern | some(as<PieceWise>(iPieceWise)) = [&]
            { return std::accumulate((*iPieceWise).begin(), (*iPieceWise).end(), false_, [&](auto &&result, auto &&e)
                                     { return union_(result, solve(e.first, var, solveInequation(e.second, var, domain))); }); },
            // assume is poly
            pattern | _ = [&]
            {
                auto const sol = solvePoly(ex, var);
                return intersect(sol, domain);
            });
    }